

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O3

CScript * BuildScript<CScript,opcodetype,CScript&,opcodetype,CScript&,opcodetype>
                    (CScript *__return_storage_ptr__,CScript *inputs,opcodetype *inputs_1,
                    CScript *inputs_2,opcodetype *inputs_3,CScript *inputs_4,opcodetype *inputs_5)

{
  opcodetype opcode;
  size_type sVar1;
  long lVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  CScript *pCVar8;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  opcode = *inputs_1;
  sVar1 = (inputs->super_CScriptBase)._size;
  pcVar3 = (inputs->super_CScriptBase)._union.indirect_contents.indirect;
  uVar4 = *(undefined8 *)((long)&(inputs->super_CScriptBase)._union + 8);
  uVar5 = *(undefined8 *)((long)&(inputs->super_CScriptBase)._union + 0x14);
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0xc) =
       *(undefined8 *)((long)&(inputs->super_CScriptBase)._union + 0xc);
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x14) = uVar5;
  (__return_storage_ptr__->super_CScriptBase)._union.indirect_contents.indirect = pcVar3;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 8) = uVar4;
  (__return_storage_ptr__->super_CScriptBase)._size = sVar1;
  (inputs->super_CScriptBase)._size = 0;
  CScript::operator<<(__return_storage_ptr__,opcode);
  uVar6 = (__return_storage_ptr__->super_CScriptBase)._size;
  uVar7 = uVar6 - 0x1d;
  if (uVar6 < 0x1d) {
    uVar7 = uVar6;
  }
  pCVar8 = (CScript *)(__return_storage_ptr__->super_CScriptBase)._union.indirect_contents.indirect;
  if (uVar6 < 0x1d) {
    pCVar8 = __return_storage_ptr__;
  }
  uVar6 = (inputs_2->super_CScriptBase)._size;
  if (0x1c < uVar6) {
    inputs_2 = (CScript *)(inputs_2->super_CScriptBase)._union.indirect_contents.indirect;
    uVar6 = uVar6 - 0x1d;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  insert<prevector<28U,_unsigned_char,_unsigned_int,_int>::iterator>
            (&__return_storage_ptr__->super_CScriptBase,
             (uchar *)((long)&(pCVar8->super_CScriptBase)._union + (long)(int)uVar7),
             (iterator)inputs_2,(uchar *)((long)inputs_2 + (long)(int)uVar6));
  CScript::operator<<(__return_storage_ptr__,*inputs_3);
  uVar6 = (__return_storage_ptr__->super_CScriptBase)._size;
  uVar7 = uVar6 - 0x1d;
  if (uVar6 < 0x1d) {
    uVar7 = uVar6;
  }
  pCVar8 = (CScript *)(__return_storage_ptr__->super_CScriptBase)._union.indirect_contents.indirect;
  if (uVar6 < 0x1d) {
    pCVar8 = __return_storage_ptr__;
  }
  uVar6 = (inputs_4->super_CScriptBase)._size;
  if (0x1c < uVar6) {
    inputs_4 = (CScript *)(inputs_4->super_CScriptBase)._union.indirect_contents.indirect;
    uVar6 = uVar6 - 0x1d;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  insert<prevector<28U,_unsigned_char,_unsigned_int,_int>::iterator>
            (&__return_storage_ptr__->super_CScriptBase,
             (uchar *)((long)&(pCVar8->super_CScriptBase)._union + (long)(int)uVar7),
             (iterator)inputs_4,(uchar *)((long)inputs_4 + (long)(int)uVar6));
  CScript::operator<<(__return_storage_ptr__,*inputs_5);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

CScript BuildScript(Ts&&... inputs)
{
    CScript ret;
    int cnt{0};

    ([&ret, &cnt] (Ts&& input) {
        if constexpr (std::is_same_v<std::remove_cv_t<std::remove_reference_t<Ts>>, CScript>) {
            // If it is a CScript, extend ret with it. Move or copy the first element instead.
            if (cnt == 0) {
                ret = std::forward<Ts>(input);
            } else {
                ret.insert(ret.end(), input.begin(), input.end());
            }
        } else {
            // Otherwise invoke CScript::operator<<.
            ret << input;
        }
        cnt++;
    } (std::forward<Ts>(inputs)), ...);

    return ret;
}